

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

void __thiscall QByteArray::reallocData(QByteArray *this,qsizetype alloc,AllocationOption option)

{
  QArrayData *data;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  size_t __n;
  long in_FS_OFFSET;
  pair<QArrayData_*,_void_*> pVar4;
  QArrayData *d;
  QArrayDataPointer<char> local_48;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (alloc == 0) {
    local_48.d = (Data *)0x0;
    local_48.ptr = "";
    local_48.size = 0;
    QArrayDataPointer<char>::operator=(&this->d,&local_48);
  }
  else {
    data = &((this->d).d)->super_QArrayData;
    pcVar2 = (this->d).ptr;
    pcVar3 = (char *)((ulong)((long)&data[1].alloc + 7U) & 0xfffffffffffffff0);
    if (data == (QArrayData *)0x0) {
      bVar1 = true;
    }
    else {
      bVar1 = 1 < (data->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((data == (QArrayData *)0x0 || (pcVar2 == pcVar3 || (long)pcVar2 - (long)pcVar3 < 0)) &&
       (!bVar1)) {
      pVar4 = QArrayData::reallocateUnaligned(data,pcVar2,1,alloc,option);
      (this->d).d = (Data *)pVar4.first;
      (this->d).ptr = (char *)pVar4.second;
      goto LAB_0011fa20;
    }
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
    __n = (this->d).size;
    if (alloc <= (long)__n) {
      __n = alloc;
    }
    local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcVar2 = (char *)QArrayData::allocate1(&local_30,alloc,option);
    local_48.d = (Data *)local_30;
    local_48.ptr = pcVar2;
    local_48.size = __n;
    if (0 < (long)__n) {
      memcpy(pcVar2,(this->d).ptr,__n);
    }
    pcVar2[__n] = '\0';
    QArrayDataPointer<char>::operator=(&this->d,&local_48);
  }
  if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d)->super_QArrayData,1,0x10);
    }
  }
LAB_0011fa20:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QByteArray::reallocData(qsizetype alloc, QArrayData::AllocationOption option)
{
    if (!alloc) {
        d = DataPointer::fromRawData(&_empty, 0);
        return;
    }

    // don't use reallocate path when reducing capacity and there's free space
    // at the beginning: might shift data pointer outside of allocated space
    const bool cannotUseReallocate = d.freeSpaceAtBegin() > 0;

    if (d->needsDetach() || cannotUseReallocate) {
        DataPointer dd(alloc, qMin(alloc, d.size), option);
        Q_CHECK_PTR(dd.data());
        if (dd.size > 0)
            ::memcpy(dd.data(), d.data(), dd.size);
        dd.data()[dd.size] = 0;
        d = dd;
    } else {
        d->reallocate(alloc, option);
    }
}